

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obme.h
# Opt level: O0

char obme::OBME<char>(char value)

{
  byte in_DIL;
  anon_union_8_2_b2ad5014 reinterpret;
  undefined1 local_10;
  
  if (_OBME_MASK == (undefined8 *)0x0) {
    obme_init();
  }
  local_10 = (byte)*_OBME_MASK ^ in_DIL;
  return local_10;
}

Assistant:

T OBME(T value)
	{
#if __cplusplus > 199711L
		static_assert(sizeof(T) <= sizeof(obme_t), "OBME can not obfuscate types greater than obme_t.");
#endif
		
		// Lazy initialization
		if(_OBME_MASK == NULL)
			obme_init();
		
		
		union {
			T value;
			obme_t integer;
		} reinterpret;
		reinterpret.integer = 0;
		reinterpret.value = value;
		reinterpret.integer ^= *_OBME_MASK;
		
		return reinterpret.value;
	}